

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall tournser::print_summary(tournser *this)

{
  ostream *poVar1;
  reference pvVar2;
  reference pvVar3;
  index_t iVar4;
  long local_48;
  index_t i_1;
  index_t i;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> inf_pairs;
  tournser *this_local;
  
  if ((this->python & 1U) == 0) {
    inf_pairs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)this;
    num_infinite_pairs((vector<float,_std::allocator<float>_> *)local_28,this);
    std::ostream::operator<<((ostream *)&this->outfile,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&this->outfile,"# Betti Numbers:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (i_1 = 0; i_1 <= this->dim_max; i_1 = i_1 + 1) {
      poVar1 = std::operator<<((ostream *)&this->outfile,"#        dim H_");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_1);
      poVar1 = std::operator<<(poVar1," = ");
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_28,i_1);
      std::ostream::operator<<(poVar1,*pvVar2);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->skipped_entries,i_1);
      if (*pvVar3 != 0) {
        poVar1 = std::operator<<((ostream *)&this->outfile," : (");
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->skipped_entries,i_1);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar3);
        std::operator<<(poVar1," entries skipped)");
      }
      std::ostream::operator<<((ostream *)&this->outfile,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<((ostream *)&this->outfile,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&this->outfile,"# Cell Counts:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_48 = 0; local_48 <= this->dim_max; local_48 = local_48 + 1) {
      poVar1 = std::operator<<((ostream *)&this->outfile,"#        dim C_");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_48);
      poVar1 = std::operator<<(poVar1," = ");
      iVar4 = delta_complex_t::number_of_cells(this->complex,local_48);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::flush();
    std::ofstream::close();
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_28);
  }
  return;
}

Assistant:

void print_summary(){
		if(!python){
			std::vector<value_t> inf_pairs = num_infinite_pairs();
			outfile << std::endl;
			outfile << "# Betti Numbers:" << std::endl;
			for(index_t i = 0; i <= dim_max; i++){
				outfile << "#        dim H_" << i << " = " << inf_pairs[i];
				if( skipped_entries[i] > 0){
					outfile << " : (" << skipped_entries[i] << " entries skipped)";
				}
				outfile << std::endl;
			}
			outfile << std::endl;
			outfile << "# Cell Counts:" << std::endl;
			for(index_t i = 0; i <= dim_max; i++){
				outfile << "#        dim C_" << i << " = " << complex->number_of_cells(i) << std::endl;
			}
			outfile.flush();
			outfile.close();
		}
	}